

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::UnsafeArenaReleaseMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  long lVar1;
  Message *pMVar2;
  Type TVar3;
  uint32 uVar4;
  MessageLite *pMVar5;
  ulong uVar6;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage",
               "Field is repeated; the method requires a singular field.");
  }
  TVar3 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x50] != (FieldDescriptor)0x1) {
    if ((*(int *)(field + 0x4c) != 3) && (*(long *)(field + 0x60) == 0)) {
      ClearBit(this,message,field);
    }
    lVar1 = *(long *)(field + 0x60);
    if (lVar1 != 0) {
      uVar6 = (ulong)(uint)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x40)) >> 4) *
                            -0x55555554 + (this->schema_).oneof_case_offset_);
      if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar6) !=
          *(int *)(field + 0x38)) {
        return (Message *)0x0;
      }
      *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar6) = 0;
    }
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    pMVar2 = *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) = 0;
    return pMVar2;
  }
  if (factory == (MessageFactory *)0x0) {
    factory = this->message_factory_;
  }
  uVar4 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
  pMVar5 = ExtensionSet::UnsafeArenaReleaseMessage
                     ((ExtensionSet *)
                      ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),field,
                      factory);
  return (Message *)pMVar5;
}

Assistant:

Message* GeneratedMessageReflection::UnsafeArenaReleaseMessage(
    Message* message,
    const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || field->containing_oneof())) {
      ClearBit(message, field);
    }
    if (field->containing_oneof()) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return NULL;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = NULL;
    return ret;
  }
}